

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMap.c
# Opt level: O0

Map_Man_t *
Abc_NtkToMap(Abc_Ntk_t *pNtk,double DelayTarget,int fRecovery,float *pSwitching,int fVerbose)

{
  void *pvVar1;
  void *pvVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  char **ppNames;
  Map_Time_t *pMVar8;
  Abc_Time_t *pAVar9;
  Map_Node_t *pMVar10;
  Abc_Obj_t *pAVar11;
  Vec_Ptr_t *p;
  Abc_Obj_t *pAVar12;
  Abc_Obj_t *pAVar13;
  Map_Node_t **ppMVar14;
  int local_6c;
  Abc_Obj_t *pAStack_68;
  int i;
  Abc_Obj_t *pPrev;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pNode;
  Vec_Ptr_t *vNodes;
  Map_Node_t *pNodeMap;
  Map_Man_t *pMan;
  int fVerbose_local;
  float *pSwitching_local;
  int fRecovery_local;
  double DelayTarget_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar3 = Abc_NtkIsStrash(pNtk);
  if (iVar3 == 0) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcMap.c"
                  ,0x10d,"Map_Man_t *Abc_NtkToMap(Abc_Ntk_t *, double, int, float *, int)");
  }
  iVar4 = Abc_NtkPiNum(pNtk);
  iVar5 = Abc_NtkLatchNum(pNtk);
  iVar3 = pNtk->nBarBufs;
  iVar6 = Abc_NtkPoNum(pNtk);
  iVar7 = Abc_NtkLatchNum(pNtk);
  pNtk_local = (Abc_Ntk_t *)
               Map_ManCreate((iVar4 + iVar5) - iVar3,(iVar6 + iVar7) - pNtk->nBarBufs,fVerbose);
  if ((Map_Man_t *)pNtk_local == (Map_Man_t *)0x0) {
    pNtk_local = (Abc_Ntk_t *)0x0;
  }
  else {
    Map_ManSetAreaRecovery((Map_Man_t *)pNtk_local,fRecovery);
    ppNames = Abc_NtkCollectCioNames(pNtk,1);
    Map_ManSetOutputNames((Map_Man_t *)pNtk_local,ppNames);
    Map_ManSetDelayTarget((Map_Man_t *)pNtk_local,(float)DelayTarget);
    iVar3 = Scl_ConIsRunning();
    if ((iVar3 == 0) || (iVar3 = Scl_ConHasInArrs(), iVar3 == 0)) {
      pAVar9 = Abc_NtkGetCiArrivalTimes(pNtk);
      pMVar8 = Abc_NtkMapCopyCiArrival(pNtk,pAVar9);
      Map_ManSetInputArrivals((Map_Man_t *)pNtk_local,pMVar8);
    }
    else {
      pMVar8 = Abc_NtkMapCopyCiArrivalCon(pNtk);
      Map_ManSetInputArrivals((Map_Man_t *)pNtk_local,pMVar8);
    }
    iVar3 = Scl_ConIsRunning();
    if ((iVar3 == 0) || (iVar3 = Scl_ConHasOutReqs(), iVar3 == 0)) {
      pAVar9 = Abc_NtkGetCoRequiredTimes(pNtk);
      pMVar8 = Abc_NtkMapCopyCoRequired(pNtk,pAVar9);
      Map_ManSetOutputRequireds((Map_Man_t *)pNtk_local,pMVar8);
    }
    else {
      pMVar8 = Abc_NtkMapCopyCoRequiredCon(pNtk);
      Map_ManSetOutputRequireds((Map_Man_t *)pNtk_local,pMVar8);
    }
    Abc_NtkCleanCopy(pNtk);
    pMVar10 = Map_ManReadConst1((Map_Man_t *)pNtk_local);
    pAVar11 = Abc_AigConst1(pNtk);
    (pAVar11->field_6).pCopy = (Abc_Obj_t *)pMVar10;
    for (local_6c = 0; iVar3 = Abc_NtkCiNum(pNtk), local_6c < iVar3; local_6c = local_6c + 1) {
      pAVar11 = Abc_NtkCi(pNtk,local_6c);
      iVar3 = Abc_NtkCiNum(pNtk);
      if (local_6c == iVar3 - pNtk->nBarBufs) break;
      ppMVar14 = Map_ManReadInputs((Map_Man_t *)pNtk_local);
      pMVar10 = ppMVar14[local_6c];
      (pAVar11->field_6).pCopy = (Abc_Obj_t *)pMVar10;
      if (pSwitching != (float *)0x0) {
        Map_NodeSetSwitching(pMVar10,pSwitching[pAVar11->Id]);
      }
    }
    p = Abc_AigDfsMap(pNtk);
    for (local_6c = 0; iVar3 = Vec_PtrSize(p), local_6c < iVar3; local_6c = local_6c + 1) {
      pAVar11 = (Abc_Obj_t *)Vec_PtrEntry(p,local_6c);
      iVar3 = Abc_ObjIsLatch(pAVar11);
      if (iVar3 == 0) {
        iVar3 = Abc_ObjIsNode(pAVar11);
        if (iVar3 == 0) {
          __assert_fail("Abc_ObjIsNode(pNode)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcMap.c"
                        ,0x139,"Map_Man_t *Abc_NtkToMap(Abc_Ntk_t *, double, int, float *, int)");
        }
        pAVar13 = Abc_ObjFanin0(pAVar11);
        pvVar2 = (pAVar13->field_6).pTemp;
        iVar3 = Abc_ObjFaninC0(pAVar11);
        pAVar13 = Abc_ObjFanin1(pAVar11);
        pvVar1 = (pAVar13->field_6).pTemp;
        iVar4 = Abc_ObjFaninC1(pAVar11);
        pMVar10 = Map_NodeAnd((Map_Man_t *)pNtk_local,(Map_Node_t *)((ulong)pvVar2 ^ (long)iVar3),
                              (Map_Node_t *)((ulong)pvVar1 ^ (long)iVar4));
        if ((pAVar11->field_6).pTemp != (void *)0x0) {
          __assert_fail("pNode->pCopy == NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcMap.c"
                        ,0x13e,"Map_Man_t *Abc_NtkToMap(Abc_Ntk_t *, double, int, float *, int)");
        }
        (pAVar11->field_6).pCopy = (Abc_Obj_t *)pMVar10;
        if (pSwitching != (float *)0x0) {
          Map_NodeSetSwitching(pMVar10,pSwitching[pAVar11->Id]);
        }
        iVar3 = Abc_AigNodeIsChoice(pAVar11);
        if (iVar3 != 0) {
          pAStack_68 = pAVar11;
          for (pPrev = (Abc_Obj_t *)(pAVar11->field_5).pData; pPrev != (Abc_Obj_t *)0x0;
              pPrev = (Abc_Obj_t *)(pPrev->field_5).pData) {
            Map_NodeSetNextE((Map_Node_t *)(pAStack_68->field_6).pCopy,
                             (Map_Node_t *)(pPrev->field_6).pCopy);
            Map_NodeSetRepr((Map_Node_t *)(pPrev->field_6).pCopy,
                            (Map_Node_t *)(pAVar11->field_6).pCopy);
            pAStack_68 = pPrev;
          }
        }
      }
      else {
        pAVar13 = Abc_ObjFanin0(pAVar11);
        pAVar12 = Abc_ObjFanin0(pAVar13);
        pvVar2 = (pAVar12->field_6).pTemp;
        iVar3 = Abc_ObjFaninC0(pAVar13);
        pMVar10 = Map_NodeBuf((Map_Man_t *)pNtk_local,(Map_Node_t *)((ulong)pvVar2 ^ (long)iVar3));
        pAVar11 = Abc_ObjFanout0(pAVar11);
        (pAVar11->field_6).pCopy = (Abc_Obj_t *)pMVar10;
      }
    }
    iVar3 = Map_ManReadBufNum((Map_Man_t *)pNtk_local);
    if (iVar3 != pNtk->nBarBufs) {
      __assert_fail("Map_ManReadBufNum(pMan) == pNtk->nBarBufs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcMap.c"
                    ,0x14b,"Map_Man_t *Abc_NtkToMap(Abc_Ntk_t *, double, int, float *, int)");
    }
    Vec_PtrFree(p);
    for (local_6c = 0; iVar3 = Abc_NtkCoNum(pNtk), local_6c < iVar3; local_6c = local_6c + 1) {
      pAVar11 = Abc_NtkCo(pNtk,local_6c);
      iVar3 = Abc_NtkCoNum(pNtk);
      if (local_6c == iVar3 - pNtk->nBarBufs) {
        return (Map_Man_t *)pNtk_local;
      }
      pAVar13 = Abc_ObjFanin0(pAVar11);
      pvVar2 = (pAVar13->field_6).pTemp;
      iVar3 = Abc_ObjFaninC0(pAVar11);
      ppMVar14 = Map_ManReadOutputs((Map_Man_t *)pNtk_local);
      ppMVar14[local_6c] = (Map_Node_t *)((ulong)pvVar2 ^ (long)iVar3);
    }
  }
  return (Map_Man_t *)pNtk_local;
}

Assistant:

Map_Man_t * Abc_NtkToMap( Abc_Ntk_t * pNtk, double DelayTarget, int fRecovery, float * pSwitching, int fVerbose )
{
    Map_Man_t * pMan;
    Map_Node_t * pNodeMap;
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pNode, * pFanin, * pPrev;
    int i;

    assert( Abc_NtkIsStrash(pNtk) );

    // start the mapping manager and set its parameters
    pMan = Map_ManCreate( Abc_NtkPiNum(pNtk) + Abc_NtkLatchNum(pNtk) - pNtk->nBarBufs, Abc_NtkPoNum(pNtk) + Abc_NtkLatchNum(pNtk) - pNtk->nBarBufs, fVerbose );
    if ( pMan == NULL )
        return NULL;
    Map_ManSetAreaRecovery( pMan, fRecovery );
    Map_ManSetOutputNames( pMan, Abc_NtkCollectCioNames(pNtk, 1) );
    Map_ManSetDelayTarget( pMan, (float)DelayTarget );

    // set arrival and requireds
    if ( Scl_ConIsRunning() && Scl_ConHasInArrs() )
        Map_ManSetInputArrivals( pMan, Abc_NtkMapCopyCiArrivalCon(pNtk) );
    else
        Map_ManSetInputArrivals( pMan, Abc_NtkMapCopyCiArrival(pNtk, Abc_NtkGetCiArrivalTimes(pNtk)) );
    if ( Scl_ConIsRunning() && Scl_ConHasOutReqs() )
        Map_ManSetOutputRequireds( pMan, Abc_NtkMapCopyCoRequiredCon(pNtk) );
    else
        Map_ManSetOutputRequireds( pMan, Abc_NtkMapCopyCoRequired(pNtk, Abc_NtkGetCoRequiredTimes(pNtk)) );

    // create PIs and remember them in the old nodes
    Abc_NtkCleanCopy( pNtk );
    Abc_AigConst1(pNtk)->pCopy = (Abc_Obj_t *)Map_ManReadConst1(pMan);
    Abc_NtkForEachCi( pNtk, pNode, i )
    {
        if ( i == Abc_NtkCiNum(pNtk) - pNtk->nBarBufs )
            break;
        pNodeMap = Map_ManReadInputs(pMan)[i];
        pNode->pCopy = (Abc_Obj_t *)pNodeMap;
        if ( pSwitching )
            Map_NodeSetSwitching( pNodeMap, pSwitching[pNode->Id] );
    }

    // load the AIG into the mapper
    vNodes = Abc_AigDfsMap( pNtk );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
    {
        if ( Abc_ObjIsLatch(pNode) )
        {
            pFanin = Abc_ObjFanin0(pNode);
            pNodeMap = Map_NodeBuf( pMan, Map_NotCond( Abc_ObjFanin0(pFanin)->pCopy, (int)Abc_ObjFaninC0(pFanin) ) );
            Abc_ObjFanout0(pNode)->pCopy = (Abc_Obj_t *)pNodeMap;
            continue;
        }
        assert( Abc_ObjIsNode(pNode) );
        // add the node to the mapper
        pNodeMap = Map_NodeAnd( pMan, 
            Map_NotCond( Abc_ObjFanin0(pNode)->pCopy, (int)Abc_ObjFaninC0(pNode) ),
            Map_NotCond( Abc_ObjFanin1(pNode)->pCopy, (int)Abc_ObjFaninC1(pNode) ) );
        assert( pNode->pCopy == NULL );
        // remember the node
        pNode->pCopy = (Abc_Obj_t *)pNodeMap;
        if ( pSwitching )
            Map_NodeSetSwitching( pNodeMap, pSwitching[pNode->Id] );
        // set up the choice node
        if ( Abc_AigNodeIsChoice( pNode ) )
            for ( pPrev = pNode, pFanin = (Abc_Obj_t *)pNode->pData; pFanin; pPrev = pFanin, pFanin = (Abc_Obj_t *)pFanin->pData )
            {
                Map_NodeSetNextE( (Map_Node_t *)pPrev->pCopy, (Map_Node_t *)pFanin->pCopy );
                Map_NodeSetRepr( (Map_Node_t *)pFanin->pCopy, (Map_Node_t *)pNode->pCopy );
            }
    }
    assert( Map_ManReadBufNum(pMan) == pNtk->nBarBufs );
    Vec_PtrFree( vNodes );

    // set the primary outputs in the required phase
    Abc_NtkForEachCo( pNtk, pNode, i )
    {
        if ( i == Abc_NtkCoNum(pNtk) - pNtk->nBarBufs )
            break;
        Map_ManReadOutputs(pMan)[i] = Map_NotCond( (Map_Node_t *)Abc_ObjFanin0(pNode)->pCopy, (int)Abc_ObjFaninC0(pNode) );
    }
    return pMan;
}